

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O0

bool __thiscall
Diligent::DeviceObjectArchive::
LoadResourceCommonData<Diligent::DearchiverBase::PSOData<Diligent::TilePipelineStateCreateInfo>>
          (DeviceObjectArchive *this,ResourceType Type,char *Name,
          PSOData<Diligent::TilePipelineStateCreateInfo> *ResData)

{
  undefined *puVar1;
  PSOData<Diligent::TilePipelineStateCreateInfo> *Str0;
  bool bVar2;
  undefined8 uVar3;
  pointer pvVar4;
  char *Str1;
  Char *pCVar5;
  char (*Args_1) [40];
  char (*in_R8) [32];
  undefined1 local_e8 [8];
  string msg_1;
  undefined1 local_c0 [7];
  bool Res;
  Serializer<(Diligent::SerializerMode)0> Ser;
  string msg;
  string _msg;
  NamedResourceKey local_50;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
  local_38;
  const_iterator it;
  PSOData<Diligent::TilePipelineStateCreateInfo> *ResData_local;
  char *Name_local;
  DeviceObjectArchive *pDStack_18;
  ResourceType Type_local;
  DeviceObjectArchive *this_local;
  
  Args_1 = (char (*) [40])0x0;
  it.
  super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
             )(_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
               )ResData;
  ResData_local = (PSOData<Diligent::TilePipelineStateCreateInfo> *)Name;
  Name_local._4_4_ = Type;
  pDStack_18 = this;
  NamedResourceKey::NamedResourceKey(&local_50,Type,Name,false);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
       ::find(&this->m_NamedResources,&local_50);
  NamedResourceKey::~NamedResourceKey(&local_50);
  _msg.field_2._8_8_ =
       std::
       unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
       ::end(&this->m_NamedResources);
  bVar2 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                      *)((long)&_msg.field_2 + 8));
  Str0 = ResData_local;
  if (bVar2) {
    FormatString<char[11],char_const*,char[32]>
              ((string *)((long)&msg.field_2 + 8),(Diligent *)"Resource \'",
               (char (*) [11])&ResData_local,(char **)"\' is not present in the archive",in_R8);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar3,0);
    }
    std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
    this_local._7_1_ = false;
  }
  else {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                           *)&local_38);
    Str1 = NamedResourceKey::GetName(&pvVar4->first);
    bVar2 = SafeStrEqual((char *)Str0,Str1);
    if (!bVar2) {
      FormatString<char[26],char[40]>
                ((string *)&Ser.m_Ptr,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SafeStrEqual(Name, it->first.GetName())",Args_1);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (char (*) [40])0x106;
      DebugAssertionFailed
                (pCVar5,"LoadResourceCommonData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectArchive.hpp"
                 ,0x106);
      std::__cxx11::string::~string((string *)&Ser.m_Ptr);
    }
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                           *)&local_38);
    ResData_local =
         (PSOData<Diligent::TilePipelineStateCreateInfo> *)NamedResourceKey::GetName(&pvVar4->first)
    ;
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                           *)&local_38);
    Serializer<(Diligent::SerializerMode)0>::Serializer
              ((Serializer<(Diligent::SerializerMode)0> *)local_c0,&(pvVar4->second).Common);
    msg_1.field_2._M_local_buf[0xf] =
         DearchiverBase::PSOData<Diligent::TilePipelineStateCreateInfo>::Deserialize
                   ((PSOData<Diligent::TilePipelineStateCreateInfo> *)
                    it.
                    super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                    ._M_cur,(char *)ResData_local,
                    (Serializer<(Diligent::SerializerMode)0> *)local_c0);
    bVar2 = Serializer<(Diligent::SerializerMode)0>::IsEnded
                      ((Serializer<(Diligent::SerializerMode)0> *)local_c0);
    if (!bVar2) {
      FormatString<char[26],char[14]>
                ((string *)local_e8,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcc16de
                 ,(char (*) [14])Args_1);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"LoadResourceCommonData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectArchive.hpp"
                 ,0x10d);
      std::__cxx11::string::~string((string *)local_e8);
    }
    this_local._7_1_ = (bool)(msg_1.field_2._M_local_buf[0xf] & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool LoadResourceCommonData(ResourceType     Type,
                                const char*      Name,
                                ReourceDataType& ResData) const
    {
        auto it = m_NamedResources.find(NamedResourceKey{Type, Name});
        if (it == m_NamedResources.end())
        {
            LOG_ERROR_MESSAGE("Resource '", Name, "' is not present in the archive");
            return false;
        }
        VERIFY_EXPR(SafeStrEqual(Name, it->first.GetName()));
        // Use string copy from the map
        Name = it->first.GetName();

        Serializer<SerializerMode::Read> Ser{it->second.Common};

        auto Res = ResData.Deserialize(Name, Ser);
        VERIFY_EXPR(Ser.IsEnded());
        return Res;
    }